

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavMoveRequestTryWrapping(ImGuiWindow *window,ImGuiNavMoveFlags move_flags)

{
  ImGuiContext *pIVar1;
  float fVar2;
  int clip_dir;
  ImGuiContext *g;
  uint uVar3;
  float fVar4;
  float fVar5;
  ImRect bb_rel;
  ImRect local_38;
  
  pIVar1 = GImGui;
  if ((((GImGui->NavWindow == window) && (GImGui->NavMoveRequest == true)) &&
      ((GImGui->NavMoveResultLocal).ID == 0)) &&
     ((((GImGui->NavMoveResultOther).ID == 0 &&
       (GImGui->NavMoveRequestForward == ImGuiNavForward_None)) &&
      (GImGui->NavLayer == ImGuiNavLayer_Main)))) {
    if (move_flags == 0) {
      __assert_fail("move_flags != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                    ,0x1f9a,
                    "void ImGui::NavMoveRequestTryWrapping(ImGuiWindow *, ImGuiNavMoveFlags)");
    }
    local_38.Min = window->NavRectRel[0].Min;
    local_38.Max = window->NavRectRel[0].Max;
    clip_dir = GImGui->NavMoveDir;
    if (clip_dir == 0) {
      if ((move_flags & 5U) == 0) {
        clip_dir = 0;
      }
      else {
        fVar5 = (window->SizeFull).x;
        fVar4 = (window->WindowPadding).x;
        fVar4 = fVar4 + fVar4 + (window->ContentSize).x;
        uVar3 = -(uint)(fVar4 <= fVar5);
        fVar5 = (float)(uVar3 & (uint)fVar5 | ~uVar3 & (uint)fVar4) - (window->Scroll).x;
        clip_dir = 0;
        if ((move_flags & 4U) != 0) {
          fVar4 = local_38.Max.y - local_38.Min.y;
          local_38.Min.y = local_38.Min.y - fVar4;
          local_38.Max.y = local_38.Max.y - fVar4;
          clip_dir = 2;
        }
        local_38.Max.x = fVar5;
        local_38.Min.x = fVar5;
        NavMoveRequestForward(0,clip_dir,&local_38,move_flags);
      }
    }
    if ((move_flags & 5U) != 0 && pIVar1->NavMoveDir == 1) {
      fVar5 = (window->Scroll).x;
      fVar2 = local_38.Max.y;
      local_38.Max = (ImVec2)(CONCAT44(local_38.Max.y,fVar5) ^ 0x80000000);
      fVar4 = local_38.Min.y;
      local_38.Min = (ImVec2)(CONCAT44(local_38.Min.y,fVar5) ^ 0x80000000);
      if ((move_flags & 4U) != 0) {
        fVar5 = fVar2 - fVar4;
        local_38.Min.y = fVar4 + fVar5;
        local_38.Max.y = fVar5 + fVar2;
        clip_dir = 3;
      }
      NavMoveRequestForward(pIVar1->NavMoveDir,clip_dir,&local_38,move_flags);
    }
    if ((move_flags & 10U) != 0 && pIVar1->NavMoveDir == 2) {
      fVar5 = (window->SizeFull).y;
      fVar4 = (window->WindowPadding).y;
      fVar4 = fVar4 + fVar4 + (window->ContentSize).y;
      uVar3 = -(uint)(fVar4 <= fVar5);
      fVar5 = (float)(uVar3 & (uint)fVar5 | ~uVar3 & (uint)fVar4) - (window->Scroll).y;
      if ((move_flags & 8U) != 0) {
        fVar4 = local_38.Max.x - local_38.Min.x;
        local_38.Min.x = local_38.Min.x - fVar4;
        local_38.Max.x = local_38.Max.x - fVar4;
        clip_dir = 0;
      }
      local_38.Max.y = fVar5;
      local_38.Min.y = fVar5;
      NavMoveRequestForward(pIVar1->NavMoveDir,clip_dir,&local_38,move_flags);
    }
    if (pIVar1->NavMoveDir == 3 && (move_flags & 10U) != 0) {
      fVar5 = (window->Scroll).y;
      fVar2 = local_38.Max.x;
      local_38.Max = (ImVec2)(CONCAT44(fVar5,local_38.Max.x) ^ 0x8000000000000000);
      fVar4 = local_38.Min.x;
      local_38.Min = (ImVec2)(CONCAT44(fVar5,local_38.Min.x) ^ 0x8000000000000000);
      if ((move_flags & 8U) != 0) {
        fVar5 = fVar2 - fVar4;
        local_38.Min.x = fVar4 + fVar5;
        local_38.Max.x = fVar5 + fVar2;
        clip_dir = 1;
      }
      NavMoveRequestForward(pIVar1->NavMoveDir,clip_dir,&local_38,move_flags);
    }
  }
  return;
}

Assistant:

void ImGui::NavMoveRequestTryWrapping(ImGuiWindow* window, ImGuiNavMoveFlags move_flags)
{
    ImGuiContext& g = *GImGui;
    if (g.NavWindow != window || !NavMoveRequestButNoResultYet() || g.NavMoveRequestForward != ImGuiNavForward_None || g.NavLayer != 0)
        return;
    IM_ASSERT(move_flags != 0); // No points calling this with no wrapping
    ImRect bb_rel = window->NavRectRel[0];

    ImGuiDir clip_dir = g.NavMoveDir;
    if (g.NavMoveDir == ImGuiDir_Left && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = ImMax(window->SizeFull.x, window->ContentSize.x + window->WindowPadding.x * 2.0f) - window->Scroll.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX) { bb_rel.TranslateY(-bb_rel.GetHeight()); clip_dir = ImGuiDir_Up; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Right && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = -window->Scroll.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX) { bb_rel.TranslateY(+bb_rel.GetHeight()); clip_dir = ImGuiDir_Down; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Up && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = ImMax(window->SizeFull.y, window->ContentSize.y + window->WindowPadding.y * 2.0f) - window->Scroll.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY) { bb_rel.TranslateX(-bb_rel.GetWidth()); clip_dir = ImGuiDir_Left; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Down && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = -window->Scroll.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY) { bb_rel.TranslateX(+bb_rel.GetWidth()); clip_dir = ImGuiDir_Right; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
}